

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::copy_raytracing_pipeline
          (Impl *this,VkRayTracingPipelineCreateInfoKHR *create_info,ScratchAllocator *alloc,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
          VkRayTracingPipelineCreateInfoKHR **out_info)

{
  VkPipelineLibraryCreateInfoKHR **sub_info;
  VkPipelineLibraryCreateInfoKHR *pVVar1;
  bool bVar2;
  VkRayTracingPipelineCreateInfoKHR *info;
  VkPipelineCreateFlags2CreateInfo *pVVar3;
  VkPipeline_T **ppVVar4;
  VkRayTracingShaderGroupCreateInfoKHR *pVVar5;
  int *piVar6;
  VkPipeline pVVar7;
  long lVar8;
  bool bVar9;
  uint32_t i;
  ulong uVar10;
  uint uVar11;
  void *pNext;
  VkPipeline *local_38;
  
  local_38 = base_pipelines;
  info = copy<VkRayTracingPipelineCreateInfoKHR>(this,create_info,1,alloc);
  uVar11 = info->flags & 0x7ffffc3f;
  info->flags = uVar11;
  pVVar3 = find_pnext<VkPipelineCreateFlags2CreateInfo>((VkStructureType)info->pNext,create_info);
  pVVar7 = (VkPipeline)0x0;
  if (pVVar3 != (VkPipelineCreateFlags2CreateInfo *)0x0) {
    uVar11 = 0;
  }
  info->flags = uVar11;
  if ((uVar11 & 4) != 0) {
    if (info->basePipelineHandle != (VkPipeline)0x0) goto LAB_00121f4f;
    uVar11 = info->basePipelineIndex;
    if ((long)(int)uVar11 < 0) goto LAB_00121f4f;
    if (base_pipeline_count <= uVar11) {
      piVar6 = (int *)__tls_get_addr(&PTR_0017cfc0);
      if (*piVar6 < 3) {
        bVar2 = Internal::log_thread_callback(LOG_ERROR,"Base pipeline index is out of range.\n");
        if (bVar2) {
          return false;
        }
        fwrite("Fossilize ERROR: Base pipeline index is out of range.\n",0x36,1,_stderr);
      }
      return false;
    }
    pVVar7 = local_38[(int)uVar11];
  }
  info->basePipelineHandle = pVVar7;
LAB_00121f4f:
  info->basePipelineIndex = -1;
  bVar9 = false;
  bVar2 = copy_stages<VkRayTracingPipelineCreateInfoKHR>
                    (this,info,alloc,device,gsmcii,(DynamicStateInfo *)0x0);
  if (bVar2) {
    bVar9 = false;
    bVar2 = copy_dynamic_state<VkRayTracingPipelineCreateInfoKHR>
                      (this,info,alloc,(DynamicStateInfo *)0x0);
    if (bVar2) {
      sub_info = &info->pLibraryInfo;
      bVar9 = false;
      bVar2 = copy_sub_create_info<VkPipelineLibraryCreateInfoKHR>
                        (this,sub_info,alloc,(DynamicStateInfo *)0x0,0);
      if (bVar2) {
        bVar9 = false;
        bVar2 = copy_sub_create_info<VkRayTracingPipelineInterfaceCreateInfoKHR>
                          (this,&info->pLibraryInterface,alloc,(DynamicStateInfo *)0x0,0);
        if (bVar2) {
          pVVar1 = *sub_info;
          if (pVVar1 != (VkPipelineLibraryCreateInfoKHR *)0x0) {
            ppVVar4 = copy<VkPipeline_T*>(this,pVVar1->pLibraries,(ulong)pVVar1->libraryCount,alloc)
            ;
            (*sub_info)->pLibraries = ppVVar4;
          }
          pVVar5 = copy<VkRayTracingShaderGroupCreateInfoKHR>
                             (this,info->pGroups,(ulong)info->groupCount,alloc);
          info->pGroups = pVVar5;
          lVar8 = 8;
          for (uVar10 = 0; uVar10 < info->groupCount; uVar10 = uVar10 + 1) {
            pVVar5 = info->pGroups;
            pNext = (void *)0x0;
            bVar2 = copy_pnext_chain(this,*(void **)((long)&pVVar5->sType + lVar8),alloc,&pNext,
                                     (DynamicStateInfo *)0x0,0);
            if (!bVar2) {
              return false;
            }
            *(void **)((long)&pVVar5->sType + lVar8) = pNext;
            *(undefined8 *)((long)&pVVar5->intersectionShader + lVar8) = 0;
            lVar8 = lVar8 + 0x30;
          }
          bVar9 = false;
          bVar2 = copy_pnext_chain(this,info->pNext,alloc,&info->pNext,(DynamicStateInfo *)0x0,0);
          if (bVar2) {
            *out_info = info;
            bVar9 = true;
          }
        }
      }
    }
  }
  return bVar9;
}

Assistant:

bool StateRecorder::Impl::copy_raytracing_pipeline(const VkRayTracingPipelineCreateInfoKHR *create_info,
                                                   ScratchAllocator &alloc, const VkPipeline *base_pipelines,
                                                   uint32_t base_pipeline_count,
                                                   VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
                                                   VkRayTracingPipelineCreateInfoKHR **out_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->flags = normalize_pipeline_creation_flags(info->flags);
	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, info->pNext))
		info->flags = 0;

	if (!update_derived_pipeline(info, base_pipelines, base_pipeline_count))
		return false;

	if (!copy_stages(info, alloc, device, gsmcii, nullptr))
		return false;
	if (!copy_dynamic_state(info, alloc, nullptr))
		return false;

	if (!copy_sub_create_info(info->pLibraryInfo, alloc, nullptr, 0))
		return false;
	if (!copy_sub_create_info(info->pLibraryInterface, alloc, nullptr, 0))
		return false;

	if (info->pLibraryInfo)
	{
		const_cast<VkPipelineLibraryCreateInfoKHR *>(info->pLibraryInfo)->pLibraries =
				copy(info->pLibraryInfo->pLibraries, info->pLibraryInfo->libraryCount, alloc);
	}

	info->pGroups = copy(info->pGroups, info->groupCount, alloc);
	for (uint32_t i = 0; i < info->groupCount; i++)
	{
		auto &group = const_cast<VkRayTracingShaderGroupCreateInfoKHR &>(info->pGroups[i]);
		const void *pNext = nullptr;
		if (!copy_pnext_chain(group.pNext, alloc, &pNext, nullptr, 0))
			return false;
		group.pNext = pNext;
		group.pShaderGroupCaptureReplayHandle = nullptr;
	}

	if (!copy_pnext_chain(info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_info = info;
	return true;
}